

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graphics.cpp
# Opt level: O2

void nite::graphicsEnd(void)

{
  print("graphics end");
  Console::end();
  FileTransfer::end();
  socketEnd();
  indexerEnd();
  SDL_DestroyWindow(Window);
  SDL_GL_DeleteContext(Context);
  return;
}

Assistant:

void nite::graphicsEnd(){
	nite::print("graphics end");
	nite::Console::end();
	nite::FileTransfer::end();
	nite::socketEnd();
	nite::indexerEnd();
	SDL_DestroyWindow(Window);
	SDL_GL_DeleteContext(Context);
}